

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribute.c
# Opt level: O1

int distribute_set_in(uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  int code;
  
  if (field == 0) {
    if (location == 0) {
      *(void **)((long)segment->data + 0x10) = buffer;
      return 1;
    }
    code = 6;
  }
  else {
    code = 7;
  }
  mixed_err(code);
  return 0;
}

Assistant:

int distribute_set_in(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct distribute_data *data = (struct distribute_data *)segment->data;
  
  switch(field){
  case MIXED_BUFFER:
    if(0 < location){
      mixed_err(MIXED_INVALID_LOCATION);
      return 0;
    }
    data->in = (struct mixed_buffer *)buffer;
    return 1;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}